

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NegaMaxSearch.h
# Opt level: O3

int negamax(int alpha,int beta,int depth)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  unsigned_long_long uVar7;
  int iVar8;
  unsigned_long_long uVar9;
  int iVar10;
  TTEntry *pTVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong *puVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  moves *pmVar23;
  unsigned_long_long *puVar24;
  unsigned_long_long *puVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  bool bVar29;
  byte bVar30;
  unsigned_long_long occupanciesCopy_1 [3];
  unsigned_long_long occupanciesCopy [3];
  moves moveList [1];
  int local_4e0;
  int local_4dc;
  int local_4d4;
  unsigned_long_long local_498;
  unsigned_long_long uStack_490;
  unsigned_long_long local_488;
  moves local_438;
  
  iVar12 = ply;
  bVar30 = 0;
  lVar22 = (long)ply;
  pvLength[lVar22] = ply;
  if (lVar22 == 0) {
    if (99 < fiftyRuleCounter) {
      return 0;
    }
    bVar3 = 1 < beta - alpha;
    uVar2 = 0;
  }
  else {
    uVar20 = (ulong)repetitionIndex;
    if ((long)uVar20 < 1) {
      if (99 < fiftyRuleCounter) {
        return 0;
      }
    }
    else {
      if (repetitionTable[0] == hashKey) {
        return 0;
      }
      uVar21 = 1;
      do {
        uVar26 = uVar21;
        if (uVar20 == uVar26) break;
        uVar21 = uVar26 + 1;
      } while (repetitionTable[uVar26] != hashKey);
      if (uVar26 < uVar20) {
        return 0;
      }
      if (99 < fiftyRuleCounter) {
        return 0;
      }
    }
    bVar3 = 1 < beta - alpha;
    uVar2 = 0;
    uVar20 = hashKey % (ulong)(long)hashEntries;
    if (hashTable[uVar20].hashKey == hashKey) {
      if (hashTable[uVar20].depth < depth) goto LAB_0010806d;
      uVar2 = 0;
      iVar15 = 0;
      if (hashTable[uVar20].score < -48000) {
        iVar15 = iVar12;
      }
      iVar14 = hashTable[uVar20].flag;
      iVar15 = iVar15 + hashTable[uVar20].score;
      iVar28 = 0;
      if (48000 < iVar15) {
        iVar28 = iVar12;
      }
      iVar15 = iVar15 - iVar28;
      iVar12 = iVar15;
      if (iVar14 == 0) {
LAB_001081a7:
        if (iVar12 != 100000 && beta - alpha < 2) {
          return iVar12;
        }
      }
      else {
        if (iVar14 == 1) {
          iVar12 = alpha;
          if (iVar15 <= alpha) goto LAB_001081a7;
        }
        else if ((iVar14 == 2) && (iVar12 = beta, beta <= iVar15)) goto LAB_001081a7;
LAB_0010806d:
        uVar2 = hashTable[uVar20].bestMove;
      }
    }
  }
  if ((nodes & 0x7ff) == 0) {
    communicate();
  }
  if (depth == 0) {
    iVar12 = quietSearch(alpha,beta);
    return iVar12;
  }
  if (0x3f < ply) {
    iVar12 = evaluate();
    return iVar12;
  }
  nodes = nodes + 1;
  if (side == 0) {
    if (bitboardsPieces[5] == 0) {
      uVar20 = 0xffffffffffffffff;
    }
    else {
      uVar20 = 0;
      uVar21 = ~bitboardsPieces[5] & bitboardsPieces[5] - 1;
      if (uVar21 != 0) {
        do {
          uVar13 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar13;
          uVar21 = uVar21 & uVar21 - 1;
        } while (uVar21 != 0);
        goto LAB_001081c7;
      }
    }
LAB_0010820f:
    uVar13 = 1;
    if ((pawnAttacks[0][uVar20] & bitboardsPieces[6]) == 0) {
LAB_00108231:
      puVar17 = bitboardsPieces + 7;
      bVar29 = false;
      goto LAB_00108237;
    }
  }
  else {
    if (bitboardsPieces[0xb] == 0) {
      uVar13 = 0xffffffff;
    }
    else {
      uVar20 = ~bitboardsPieces[0xb] & bitboardsPieces[0xb] - 1;
      if (uVar20 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        do {
          uVar13 = uVar13 + 1;
          uVar20 = uVar20 & uVar20 - 1;
        } while (uVar20 != 0);
      }
    }
LAB_001081c7:
    uVar20 = (ulong)(int)uVar13;
    if (side != 1) {
      if (side == 0) goto LAB_0010820f;
      goto LAB_00108231;
    }
    uVar13 = 1;
    if ((pawnAttacks[1][uVar20] & bitboardsPieces[0]) != 0) goto LAB_0010834a;
    puVar17 = bitboardsPieces + 1;
    bVar29 = true;
LAB_00108237:
    uVar13 = 1;
    if ((knightAttacks[uVar20] & *puVar17) == 0) {
      lVar22 = 0x40;
      if (bVar29) {
        lVar22 = 0x10;
      }
      if ((*(ulong *)((long)bitboardsPieces + lVar22) &
          bishopAttacks[uVar20]
          [(bishopMasks[uVar20] & occupancies[2]) * bishopMagicNumbers[uVar20] >>
           (-(char)bishopRelevantBits[uVar20] & 0x3fU)]) == 0) {
        lVar22 = 0x48;
        if (bVar29) {
          lVar22 = 0x18;
        }
        if ((*(ulong *)((long)bitboardsPieces + lVar22) &
            rookAttacks[uVar20]
            [(occupancies[2] & rookMasks[uVar20]) * rookMagicNumbers[uVar20] >>
             (-(char)rookRelevantBits[uVar20] & 0x3fU)]) == 0) {
          lVar22 = 0x50;
          if (bVar29) {
            lVar22 = 0x20;
          }
          if ((*(ulong *)((long)bitboardsPieces + lVar22) &
              (rookAttacks[uVar20]
               [(occupancies[2] & rookMasks[uVar20]) * rookMagicNumbers[uVar20] >>
                (-(char)rookRelevantBits[uVar20] & 0x3fU)] |
              bishopAttacks[uVar20]
              [(bishopMasks[uVar20] & occupancies[2]) * bishopMagicNumbers[uVar20] >>
               (-(char)bishopRelevantBits[uVar20] & 0x3fU)])) == 0) {
            lVar22 = 0x58;
            if (bVar29) {
              lVar22 = 0x28;
            }
            uVar13 = (uint)((kingAttacks[uVar20] & *(ulong *)((long)bitboardsPieces + lVar22)) != 0)
            ;
          }
        }
      }
    }
  }
LAB_0010834a:
  iVar28 = uVar13 + depth;
  iVar14 = evaluate();
  uVar5 = hashKey;
  iVar15 = enpassant;
  iVar12 = side;
  if ((uVar13 == 0 && !bVar3) && iVar28 < 3) {
    iVar14 = iVar14 + depth * -0x78;
    iVar4 = iVar14;
  }
  else {
    bVar29 = uVar13 == 0;
    if (ply == 0 || (iVar28 < 3 || !bVar29)) goto LAB_00108545;
    puVar24 = bitboardsPieces;
    pmVar23 = &local_438;
    for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
      *(unsigned_long_long *)pmVar23->moves = *puVar24;
      puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
      pmVar23 = (moves *)((long)pmVar23 + ((ulong)bVar30 * -2 + 1) * 8);
    }
    local_488 = occupancies[2];
    local_498 = occupancies[0];
    uStack_490 = occupancies[1];
    ply = ply + 1;
    lVar22 = (long)repetitionIndex;
    repetitionIndex = repetitionIndex + 1;
    repetitionTable[lVar22 + 1] = hashKey;
    iVar10 = fiftyRuleCounter;
    iVar8 = castle;
    if ((long)enpassant != 0x40) {
      hashKey = enpassantKeys[enpassant] ^ hashKey;
    }
    enpassant = 0x40;
    side = side ^ 1;
    hashKey = hashKey ^ sideKey;
    iVar14 = negamax(-beta,1 - beta,depth + -3);
    ply = ply + -1;
    repetitionIndex = repetitionIndex + -1;
    pmVar23 = &local_438;
    puVar24 = bitboardsPieces;
    for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar24 = *(unsigned_long_long *)pmVar23->moves;
      pmVar23 = (moves *)((long)pmVar23 + ((ulong)bVar30 * -2 + 1) * 8);
      puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
    }
    if (isStopped == 1) {
      occupancies[0] = local_498;
      occupancies[1] = uStack_490;
      occupancies[2] = local_488;
      side = iVar12;
      enpassant = iVar15;
      castle = iVar8;
      hashKey = uVar5;
      fiftyRuleCounter = iVar10;
      return 0;
    }
    iVar14 = -iVar14;
    iVar4 = beta;
    occupancies[0] = local_498;
    occupancies[1] = uStack_490;
    occupancies[2] = local_488;
    castle = iVar8;
    fiftyRuleCounter = iVar10;
  }
  bVar29 = true;
  if (beta <= iVar14) {
    side = iVar12;
    enpassant = iVar15;
    hashKey = uVar5;
    return iVar4;
  }
LAB_00108545:
  side = iVar12;
  enpassant = iVar15;
  hashKey = uVar5;
  if (iVar28 < 4 && (!bVar3 && (char)uVar13 == '\0')) {
    iVar15 = evaluate();
    iVar12 = iVar15 + 0x7d;
    if (iVar12 < beta) {
      if (depth == 1) {
        iVar15 = quietSearch(alpha,beta);
        if (iVar15 <= iVar12) {
          return iVar12;
        }
        return iVar15;
      }
      iVar15 = iVar15 + 300;
      if ((depth < 3 && iVar15 < beta) && (iVar12 = quietSearch(alpha,beta), iVar12 < beta)) {
        if (iVar15 < iVar12) {
          return iVar12;
        }
        return iVar15;
      }
    }
  }
  generateMoves(&local_438);
  if (followPV != 0) {
    followPV = 0;
    if (0 < (long)local_438.count) {
      lVar22 = 0;
      do {
        if (pvTable[0][ply] == local_438.moves[lVar22]) {
          scorePV = 1;
          followPV = 1;
        }
        lVar22 = lVar22 + 1;
      } while (local_438.count != lVar22);
    }
  }
  sortMoves(&local_438,uVar2);
  if (0 < local_438.count) {
    uVar20 = (ulong)(uint)ply;
    lVar22 = 0;
    local_4e0 = 1;
    local_4d4 = 0;
    local_4dc = 0;
    iVar12 = repetitionIndex;
    do {
      iVar8 = fiftyRuleCounter;
      uVar9 = hashKey;
      iVar4 = castle;
      iVar14 = enpassant;
      iVar15 = side;
      uVar7 = occupancies[2];
      uVar6 = occupancies[1];
      uVar5 = occupancies[0];
      puVar24 = bitboardsPieces;
      puVar25 = &local_498;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar25 = *puVar24;
        puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
        puVar25 = puVar25 + (ulong)bVar30 * -2 + 1;
      }
      ply = (int)uVar20 + 1;
      repetitionIndex = iVar12 + 1;
      repetitionTable[(long)iVar12 + 1] = hashKey;
      iVar12 = makeMove(local_438.moves[lVar22],0);
      if (iVar12 == 0) {
        ply = ply - 1;
        uVar20 = (ulong)(uint)ply;
        iVar12 = repetitionIndex + -1;
        repetitionIndex = iVar12;
      }
      else {
        if (local_4d4 == 0) {
LAB_001087cd:
          iVar12 = negamax(-beta,-alpha,iVar28 + -1);
          uVar16 = -iVar12;
        }
        else if (((bool)(3 < local_4d4 & bVar29 & 2 < iVar28)) &&
                ((*(byte *)((long)local_438.moves + lVar22 * 4 + 2) & 0x1f) == 0)) {
          iVar12 = negamax(~alpha,-alpha,iVar28 + -2);
          uVar16 = -iVar12;
          if (SBORROW4(alpha,uVar16) != alpha + iVar12 < 0) goto LAB_00108781;
        }
        else {
LAB_00108781:
          iVar12 = negamax(~alpha,-alpha,iVar28 + -1);
          uVar16 = -iVar12;
          if ((int)uVar16 < beta && SBORROW4(alpha,uVar16) != alpha + iVar12 < 0) goto LAB_001087cd;
        }
        iVar10 = ply;
        lVar27 = (long)ply;
        uVar20 = lVar27 - 1;
        iVar19 = (int)uVar20;
        iVar12 = repetitionIndex + -1;
        puVar24 = &local_498;
        puVar25 = bitboardsPieces;
        repetitionIndex = iVar12;
        ply = iVar19;
        for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar25 = *puVar24;
          puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
          puVar25 = puVar25 + (ulong)bVar30 * -2 + 1;
        }
        occupancies[0] = uVar5;
        occupancies[1] = uVar6;
        occupancies[2] = uVar7;
        side = iVar15;
        enpassant = iVar14;
        castle = iVar4;
        hashKey = uVar9;
        fiftyRuleCounter = iVar8;
        if (isStopped == 1) goto LAB_001089f4;
        local_4dc = local_4dc + 1;
        local_4d4 = local_4d4 + 1;
        if (alpha < (int)uVar16) {
          uVar2 = local_438.moves[lVar22];
          if ((uVar2 >> 0x14 & 1) == 0) {
            piVar1 = (int *)((long)historyMoves[0] +
                            (ulong)(uVar2 >> 4 & 0xfc) + (ulong)(uVar2 >> 4 & 0xf00));
            *piVar1 = *piVar1 + iVar28;
          }
          *(uint *)((long)pvTable + uVar20 * 0x104) = uVar2;
          iVar15 = pvLength[lVar27];
          if (iVar10 < iVar15) {
            lVar18 = 0;
            do {
              pvTable[uVar20][lVar27 + lVar18] =
                   *(int *)((long)pvTable + lVar18 * 4 + lVar27 * 0x104);
              lVar18 = lVar18 + 1;
            } while (iVar15 - lVar27 != lVar18);
          }
          *(int *)((long)&nodes + lVar27 * 4 + 4) = iVar15;
          pTVar11 = hashTable;
          if (beta <= (int)uVar16) {
            iVar12 = 0;
            if (beta < -48000) {
              iVar12 = iVar19;
            }
            iVar15 = 0;
            if (48000 < beta - iVar12) {
              iVar15 = iVar19;
            }
            uVar20 = uVar9 % (ulong)(long)hashEntries;
            hashTable[uVar20].hashKey = uVar9;
            pTVar11[uVar20].score = iVar15 + (beta - iVar12);
            pTVar11[uVar20].flag = 2;
            pTVar11[uVar20].depth = iVar28;
            pTVar11[uVar20].bestMove = uVar2;
            uVar2 = local_438.moves[lVar22];
            if ((uVar2 >> 0x14 & 1) == 0) {
              lVar22 = (long)ply;
              killerMoves[1][lVar22] = killerMoves[0][lVar22];
              killerMoves[0][lVar22] = uVar2;
              return beta;
            }
            return beta;
          }
          local_4e0 = 0;
          alpha = uVar16;
        }
      }
      pTVar11 = hashTable;
      lVar22 = lVar22 + 1;
    } while (lVar22 < local_438.count);
    if (local_4dc != 0) {
      iVar12 = 0;
      if (alpha < -48000) {
        iVar12 = ply;
      }
      iVar15 = ply;
      if (alpha - iVar12 < 0xbb81) {
        iVar15 = 0;
      }
      uVar20 = hashKey % (ulong)(long)hashEntries;
      hashTable[uVar20].hashKey = hashKey;
      pTVar11[uVar20].score = iVar15 + (alpha - iVar12);
      pTVar11[uVar20].flag = local_4e0;
      pTVar11[uVar20].depth = iVar28;
      pTVar11[uVar20].bestMove = uVar2;
      return alpha;
    }
  }
  if (uVar13 == 0) {
LAB_001089f4:
    iVar12 = 0;
  }
  else {
    iVar12 = ply + -49000;
  }
  return iVar12;
}

Assistant:

static inline int negamax(int alpha, int beta, int depth) {
    // initializing length of current variation
    pvLength[ply] = ply;

    int score;

    int bestMove = 0;

    int hashFlag = ALPHA;

    if ((ply && isRepetition()) || fiftyRuleCounter >= 100) {
        // if repetition is found \ 50 move rule found -> return draw value
        return 0;
    }


    // checking if current node is PV or not
    int pvNode = beta - alpha > 1;


    if (ply && (score = readHashEntry(alpha, beta, &bestMove, depth)) != NO_HASH_FOUND && pvNode == 0) {
        // if search deep is bigger than 0 AND hash entry was found, AND current node is not a PV node -> return score found in entry
        return score;
    }


    if ((nodes & 2047) == 0) {
        // check for GUI/user input
        communicate();
    }


    if (depth == 0) {

        // no more depth to search in negamax, go to quiet search(escape condition)
        return quietSearch(alpha, beta);
    }


    if (ply > MAX_PLY - 1) {
        // in case we are to deep in the search -> return evaluation of the board
        return evaluate();
    }

    nodes++;

    // checking for checks
    int isInCheck = isSquareAttacked((side == WHITE) ? getLSBIndex(bitboardsPieces[K]) : getLSBIndex(bitboardsPieces[k]),
                                     side ^ 1);


    if (isInCheck) {
        // if in check -> scan deeper
        depth++;
    }


    int legalMoves = 0;



    // evaluation pruning / static null move pruning
    int staticEval = evaluate();
    if (depth < 3 && !pvNode && !isInCheck && abs(beta - 1) > -INFINITY + 100) {
        int evalMargin = 120 * depth;
        if (staticEval - evalMargin >= beta) {
            return staticEval - evalMargin;
        }

    }

    // null move pruning -> making another move from oppononet before continue evaluating to prune more moves
    if (depth >= 3 && isInCheck == 0 && ply) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;

        // switch sides and fix hashing for switching sides
        if (enpassant != NO_SQUARE)
            hashKey ^= enpassantKeys[enpassant];
        enpassant = NO_SQUARE;

        side ^= 1;
        hashKey ^= sideKey;

        // searching with smaller depth, with considiration on limit reduction
        score = -negamax(-beta, -beta + 1, depth - 1 - 2);


        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // flag to stop, quit searching
            return 0;
        }

        if (score >= beta) {
            // node (position) fails high
            return beta;
        }

    }

    // razoring
    if (!pvNode && !isInCheck && depth <= 3) {
        // get static eval and add first bonus
        score = evaluate() + 125;

        // define new score
        int newScore;

        // static evaluation indicates a fail-low node
        if (score < beta) {
            // on depth 1
            if (depth == 1) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // return quiescence score if it's greater then static evaluation score
                return (newScore > score) ? newScore : score;
            }

            // add second bonus to static evaluation
            score += 175;

            // static evaluation indicates a fail-low node
            if (score < beta && depth <= 2) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // quiescence score indicates fail-low node
                if (newScore < beta)
                    // return quiescence score if it's greater then static evaluation score
                    return (newScore > score) ? newScore : score;
            }
        }
    }


    moves moveList[1];
    generateMoves(moveList);


    if (followPV) {
        //following Principal variation Line(PV) ->  enable PV move scoring
        enablePvScoring(moveList);
    }

    sortMoves(moveList, bestMove);

    // number of moves searched in a move list
    int movesSearched = 0;


    for (int count = 0; count < moveList->count; count++) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;


        if (makeMove(moveList->moves[count], ALL_MOVES) == 0) {
            // if invalid move -> go back to another move
            ply--;
            repetitionIndex--;
            continue;
        }

        legalMoves++;


        if (movesSearched == 0) {
            // no search occured yet -> search normally
            score = -negamax(-beta, -alpha, depth - 1);
        }
            // Late Move Reduction
        else {
            // condition to consider LMR
            if (
                    movesSearched >= fullDepthMoves &&
                    depth >= reductionLimit &&
                    isInCheck == 0 &&
                    getMoveCapture(moveList->moves[count]) == 0 &&
                    getMovePromoted(moveList->moves[count]) == 0)
                // search current move with reduced depth:
                score = -negamax(-alpha - 1, -alpha, depth - 2);

                // ensure full depth is going to be done
            else
                score = alpha + 1;

            // principle variation search PVS
            if (score > alpha) {
                //Focusing on Principal Variation
                score = -negamax(-alpha - 1, -alpha, depth - 1);

                // If Reduction was wrong -> try and fixed it with search with more depth and normal alpha beta score bounds
                if ((score > alpha) && (score < beta)) {
                    score = -negamax(-beta, -alpha, depth - 1);
                }

            }
        }

        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // Stop search due to signal by user \ GUI
            return 0;
        }


        movesSearched++;


        if (score > alpha) {
            // found a better move -> mark this move as Principal variation Node
            hashFlag = PV;

            bestMove = moveList->moves[count];

            if (getMoveCapture(moveList->moves[count]) == 0) {
                // if not a capture -> store as history move
                historyMoves[getMovePiece(moveList->moves[count])][getMoveTarget(
                        moveList->moves[count])] += depth;

            }

            // PV node (position), writing it to PV table
            alpha = score;
            pvTable[ply][ply] = moveList->moves[count];
            for (int nextPly = ply + 1; nextPly < pvLength[ply + 1]; nextPly++) {
                // copy move from deeper ply into a current ply's line
                pvTable[ply][nextPly] = pvTable[ply + 1][nextPly];
            }
            pvLength[ply] = pvLength[ply + 1];


            if (score >= beta) {
                // storing move as beta
                writeHashEntry(beta, bestMove, depth, BETA);


                if (getMoveCapture(moveList->moves[count]) == 0) {
                    // on quiet moves -> store killer moves
                    killerMoves[1][ply] = killerMoves[0][ply];
                    killerMoves[0][ply] = moveList->moves[count];
                }

                // node (position) fails high
                return beta;
            }
        }
    }


    if (legalMoves == 0) {
        // we don't have any legal moves to make in the current postion -> check for mate or stalmate
        if (isInCheck) {
            // Mate: returning MATE_VALUE + ply to consider fast mate first
            return -MATE_VALUE + ply;
        } else {
            // StalMate ->  return draw score
            return 0;
        }

    }

    // store hash entry with the score equal to alpha
    writeHashEntry(alpha, bestMove, depth, hashFlag);

    // return fail low score
    return alpha;
}